

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

int find_process_slot(int pid)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = &UJ->PID;
  lVar2 = 0;
  while( true ) {
    if (NPROCS <= lVar2) {
      return -1;
    }
    if (*piVar1 == pid) break;
    lVar2 = lVar2 + 1;
    piVar1 = piVar1 + 6;
  }
  return (int)lVar2;
}

Assistant:

int find_process_slot(int pid)
/* Find a slot with the specified pid */

{
  for (int slot = 0; slot < NPROCS; slot++)
    if (UJ[slot].PID == pid) {
      DBPRINT(("find_process_slot = %d.\n", slot));
      return slot;
    }
  return -1;
}